

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

hittable_list * final_scene(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this;
  double dVar1;
  hittable_list *phVar2;
  int iVar3;
  hittable_list *in_RDI;
  int iVar4;
  bool bVar5;
  pointer psVar6;
  shared_ptr<lambertian> emat;
  hittable_list boxes2;
  shared_ptr<sphere> boundary;
  shared_ptr<noise_texture> pertext;
  shared_ptr<lambertian> white;
  hittable_list *objects;
  int ny;
  int nx;
  shared_ptr<lambertian> moving_sphere_material;
  shared_ptr<lambertian> ground;
  int nn;
  hittable_list boxes1;
  shared_ptr<diffuse_light> light;
  stbi_uc *tex_data;
  undefined1 local_288 [16];
  hittable_list local_278;
  vec3 local_258;
  undefined1 local_238 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  undefined1 local_218 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  vec3 local_1f8;
  hittable_list *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  vec3 local_1c8;
  undefined1 local_1a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  value_type local_188;
  double local_170;
  element_type *local_168;
  undefined1 local_160 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  shared_ptr<constant_texture> local_140;
  undefined4 local_130;
  int local_12c;
  hittable_list local_128;
  __shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  shared_ptr<constant_texture> local_f8;
  value_type local_e8;
  value_type local_d8;
  value_type local_c8;
  value_type local_b8;
  value_type local_a8;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  value_type local_58;
  undefined8 local_48;
  double local_40;
  stbi_uc *local_38;
  
  local_128.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  local_128.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x3fdeb851eb851eb8;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x3fea8f5c28f5c28f;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x3fe0f5c28f5c28f6;
  local_1e0 = in_RDI;
  std::make_shared<constant_texture,vec3>(&local_1f8);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8.e + 1));
  iVar3 = 0;
  while (phVar2 = local_1e0, iVar3 != 0x14) {
    local_168 = (element_type *)((double)iVar3 * 100.0 + -1000.0);
    local_170 = (double)local_168 + 100.0;
    local_1d4 = iVar3;
    for (iVar4 = 0; iVar4 != 0x14; iVar4 = iVar4 + 1) {
      psVar6 = (pointer)((double)iVar4 * 100.0 + -1000.0);
      dVar1 = random_double();
      local_1f8.e[1] = dVar1 * 100.0 + 1.0;
      local_278.super_hittable._vptr_hittable = (_func_int **)local_168;
      local_278.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.e[2] = (double)psVar6 + 100.0;
      local_1f8.e[0] = local_170;
      local_278.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = psVar6;
      std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
                (&local_1c8,(vec3 *)(local_288 + 0x10),(shared_ptr<lambertian> *)&local_1f8);
      local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1c8.e[0];
      local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.e[1];
      local_1c8.e[0] = 0.0;
      local_1c8.e[1] = 0.0;
      std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
                (&local_128.objects,&local_188);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8.e + 1));
    }
    iVar3 = local_1d4 + 1;
  }
  (local_1e0->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  (local_1e0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.e[0] = (double)((ulong)local_1f8.e[0] & 0xffffffff00000000);
  (local_1e0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_1e0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.e[0]._0_4_ = 1;
  std::make_shared<bvh_node,hittable_list&,int,int>
            ((hittable_list *)(local_288 + 0x10),(int *)&local_128,(int *)&local_1f8);
  this = &phVar2->objects;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278.super_hittable._vptr_hittable;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_278.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.objects);
  local_278.super_hittable._vptr_hittable = (_func_int **)0x401c000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x401c000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x401c000000000000;
  std::make_shared<constant_texture,vec3>(&local_1f8);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8.e + 1));
  local_1f8.e[0] = (double)CONCAT44(local_1f8.e[0]._4_4_,0x7b);
  local_1c8.e[0] = (double)CONCAT44(local_1c8.e[0]._4_4_,0x1a7);
  local_258.e[0]._0_4_ = 0x93;
  local_160._16_4_ = 0x19c;
  local_238._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)(local_288 + 0x10),(int *)&local_1f8,(int *)&local_1c8,(int *)&local_258,
             (int *)(local_160 + 0x10),(shared_ptr<diffuse_light> *)local_238);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278.super_hittable._vptr_hittable;
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_278.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.objects);
  local_1f8.e[0] = 400.0;
  local_1f8.e[1] = 400.0;
  local_1f8.e[2] = 200.0;
  local_1c8.e[0] = 430.0;
  local_1c8.e[1] = 400.0;
  local_1c8.e[2] = 200.0;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x3fe6666666666666;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x3fd3333333333333;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x3fb999999999999a;
  std::make_shared<constant_texture,vec3>(&local_258);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_160 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  local_258.e[0] = (double)((ulong)local_258.e[0]._4_4_ << 0x20);
  local_238._0_4_ = 1;
  local_288._0_4_ = 0x32;
  std::make_shared<moving_sphere,vec3&,vec3&,int,int,int,std::shared_ptr<lambertian>&>
            ((vec3 *)(local_288 + 0x10),&local_1f8,(int *)&local_1c8,(int *)&local_258,
             (int *)local_238,(shared_ptr<lambertian> *)local_288);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278.super_hittable._vptr_hittable;
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_278.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.objects);
  local_278.super_hittable._vptr_hittable = (_func_int **)0x4070400000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4046800000000000;
  local_238._16_4_ = 0x32;
  local_288._0_8_ = (element_type *)0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)local_238);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            (&local_258,(int *)(local_288 + 0x10),(shared_ptr<dielectric> *)(local_238 + 0x10));
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
  local_278.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  local_218._16_4_ = 0x32;
  local_258.e[0] = 0.8;
  local_258.e[1] = 0.8;
  local_258.e[2] = 0.9;
  local_238._16_8_ = 10.0;
  std::make_shared<metal,vec3,double>((vec3 *)local_288,local_258.e);
  std::make_shared<sphere,vec3,int,std::shared_ptr<metal>>
            ((vec3 *)local_238,(int *)(local_288 + 0x10),(shared_ptr<metal> *)(local_218 + 0x10));
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238._0_8_;
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
  local_238._0_8_ = (element_type *)0x0;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  local_278.super_hittable._vptr_hittable = (_func_int **)0x4076800000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  local_238._16_4_ = 0x46;
  local_288._0_8_ = (element_type *)0x3ff8000000000000;
  std::make_shared<dielectric,double>(local_258.e);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_238,(int *)(local_288 + 0x10),
             (shared_ptr<dielectric> *)(local_238 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<sphere,void>
            (local_108,(__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)local_238);
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,(value_type *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
  local_238._16_8_ = 0.2;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x3fc999999999999a;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x3fd999999999999a;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x3feccccccccccccd;
  std::make_shared<constant_texture,vec3>((vec3 *)local_288);
  std::
  make_shared<constant_medium,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<sphere> *)&local_258,(double *)local_238,
             (shared_ptr<constant_texture> *)(local_238 + 0x10));
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._16_4_ = 5000;
  local_238._16_8_ = 1.5;
  std::make_shared<dielectric,double>((double *)local_288);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            (&local_258,(int *)(local_288 + 0x10),(shared_ptr<dielectric> *)(local_218 + 0x10));
  std::__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)local_238,
             (__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  local_238._16_8_ = 0.0001;
  local_278.super_hittable._vptr_hittable = (_func_int **)0x3ff0000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  std::make_shared<constant_texture,vec3>((vec3 *)local_288);
  std::
  make_shared<constant_medium,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<sphere> *)&local_258,(double *)local_238,
             (shared_ptr<constant_texture> *)(local_238 + 0x10));
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  local_38 = stbi_load("earthmap.jpg",&local_1cc,&local_1d0,&local_12c,0);
  std::make_shared<image_texture,unsigned_char*&,int&,int&>
            ((uchar **)(local_288 + 0x10),(int *)&local_38,&local_1cc);
  std::make_shared<lambertian,std::shared_ptr<image_texture>>
            ((shared_ptr<image_texture> *)local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.objects);
  local_278.super_hittable._vptr_hittable = (_func_int **)0x4079000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4069000000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4079000000000000;
  local_238._16_4_ = 100;
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
            (&local_258,(int *)(local_288 + 0x10),(shared_ptr<lambertian> *)(local_238 + 0x10));
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  local_278.super_hittable._vptr_hittable = (_func_int **)0x3fb999999999999a;
  std::make_shared<noise_texture,double>((double *)(local_238 + 0x10));
  local_278.super_hittable._vptr_hittable = (_func_int **)0x406b800000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4071800000000000;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4072c00000000000;
  local_218._0_4_ = 0x50;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)(local_218 + 0x10));
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            (&local_258,(int *)(local_288 + 0x10),(shared_ptr<lambertian> *)local_218);
  local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258.e[0];
  local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.e[1];
  local_258.e[0] = 0.0;
  local_258.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  local_278.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.e[0] = 0.73;
  local_258.e[1] = 0.73;
  local_258.e[2] = 0.73;
  std::make_shared<constant_texture,vec3>((vec3 *)local_218);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_218 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  iVar3 = 1000;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    vec3::random();
    local_1a8._0_4_ = 10;
    std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
              ((vec3 *)local_218,(int *)&local_258,(shared_ptr<lambertian> *)local_1a8);
    local_1a8._16_8_ = local_218._0_8_;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
    local_218._0_8_ = (element_type *)0x0;
    local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
              (&local_278.objects,(value_type *)(local_1a8 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_190);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  }
  local_40 = 0.0;
  local_48 = 0x3ff0000000000000;
  std::make_shared<bvh_node,hittable_list&,double,double>
            ((hittable_list *)local_160,(double *)(local_288 + 0x10),&local_40);
  local_130 = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<bvh_node>,int>
            ((shared_ptr<bvh_node> *)local_1a8,(int *)local_160);
  local_258.e[0] = -100.0;
  local_258.e[1] = 270.0;
  local_258.e[2] = 395.0;
  std::make_shared<translate,std::shared_ptr<rotate_y>,vec3>
            ((shared_ptr<rotate_y> *)local_218,(vec3 *)local_1a8);
  local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_218._0_8_;
  local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
  local_218._0_8_ = (element_type *)0x0;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  hittable_list::~hittable_list((hittable_list *)(local_288 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_140.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  hittable_list::~hittable_list(&local_128);
  return local_1e0;
}

Assistant:

hittable_list final_scene() {
    hittable_list boxes1;
    auto ground =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.48, 0.83, 0.53)));

    const int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(make_shared<box>(vec3(x0,y0,z0), vec3(x1,y1,z1), ground));
        }
    }

    hittable_list objects;

    objects.add(make_shared<bvh_node>(boxes1, 0, 1));

    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));
    objects.add(make_shared<xz_rect>(123, 423, 147, 412, 554, light));

    auto center1 = vec3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto moving_sphere_material =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.7, 0.3, 0.1)));
    objects.add(make_shared<moving_sphere>(center1, center2, 0, 1, 50, moving_sphere_material));

    objects.add(make_shared<sphere>(vec3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    objects.add(make_shared<sphere>(
            vec3(0, 150, 145), 50, make_shared<metal>(vec3(0.8, 0.8, 0.9), 10.0)
    ));

    auto boundary = make_shared<sphere>(vec3(360, 150, 145), 70, make_shared<dielectric>(1.5));
    objects.add(boundary);
    objects.add(make_shared<constant_medium>(
            boundary, 0.2, make_shared<constant_texture>(vec3(0.2, 0.4, 0.9))
    ));
    boundary = make_shared<sphere>(vec3(0, 0, 0), 5000, make_shared<dielectric>(1.5));
    objects.add(make_shared<constant_medium>(
            boundary, .0001, make_shared<constant_texture>(vec3(1,1,1))));

    int nx, ny, nn;
    auto tex_data = stbi_load("earthmap.jpg", &nx, &ny, &nn, 0);
    auto emat = make_shared<lambertian>(make_shared<image_texture>(tex_data, nx, ny));
    objects.add(make_shared<sphere>(vec3(400,200, 400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.1);
    objects.add(make_shared<sphere>(vec3(220,280, 300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(vec3::random(0,165), 10, white));
    }

    objects.add(make_shared<translate>(
            make_shared<rotate_y>(
                    make_shared<bvh_node>(boxes2, 0.0, 1.0), 15),
            vec3(-100,270,395)
                )
    );

    return objects;
}